

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::MessageLite::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  ClassDataFull *pCVar3;
  string local_f8;
  Hex local_d0;
  AlphaNum local_c0;
  AlphaNum local_90;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  ClassData *local_20;
  ClassData *data;
  MessageLite *this_local;
  
  data = (ClassData *)this;
  this_local = (MessageLite *)__return_storage_ptr__;
  iVar1 = (*this->_vptr_MessageLite[4])();
  local_20 = (ClassData *)CONCAT44(extraout_var,iVar1);
  local_49 = 0;
  if (local_20 == (ClassData *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"data != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.cc"
               ,0x86,local_48._M_len,local_48._M_str);
    local_49 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  if ((local_20->is_lite & 1U) == 0) {
    pCVar3 = internal::ClassData::full(local_20);
    (*pCVar3->descriptor_methods->debug_string)(__return_storage_ptr__,this);
  }
  else {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_90,"MessageLite at 0x");
    absl::lts_20240722::Hex::Hex<google::protobuf::MessageLite_const>(&local_d0,this,kNoPad);
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = 0;
    local_f8._M_dataplus = (_Alloc_hider)0x0;
    local_f8._1_7_ = 0;
    local_f8._M_string_length = 0;
    absl::lts_20240722::strings_internal::StringifySink::StringifySink((StringifySink *)&local_f8);
    absl::lts_20240722::AlphaNum::AlphaNum<absl::lts_20240722::Hex,void>
              (&local_c0,&local_d0,(StringifySink *)&local_f8);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_90);
    absl::lts_20240722::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageLite::DebugString() const {
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);
  if (!data->is_lite) {
    return data->full().descriptor_methods->debug_string(*this);
  }

  return absl::StrCat("MessageLite at 0x", absl::Hex(this));
}